

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::ReadStringSize(ON_BinaryArchive *this,size_t *sizeof_string)

{
  bool bVar1;
  char *sFormat;
  long lVar2;
  ON_3DM_BIG_CHUNK *pOVar3;
  int line_number;
  ON__UINT32 ui32;
  uint local_1c;
  
  local_1c = 0;
  bVar1 = ReadInt32(this,1,(ON__INT32 *)&local_1c);
  if (!bVar1) {
    return bVar1;
  }
  if ((local_1c & 0xf000000) == 0) {
    if (((((ulong)local_1c == 0) ||
         (lVar2 = (long)(this->m_chunk).m_count, pOVar3 = (this->m_chunk).m_a + lVar2,
         pOVar3 == (ON_3DM_BIG_CHUNK *)0x28 || lVar2 < 1)) || ((int)pOVar3[-1].m_typecode < 0)) ||
       (-1 < pOVar3[-1].m_big_value && (long)(ulong)local_1c <= pOVar3[-1].m_big_value))
    goto LAB_0039802d;
    sFormat = "string element count exceeds current chunk size";
    line_number = 0x604;
  }
  else {
    sFormat = "string element count is impossibly large";
    line_number = 0x5f7;
  }
  bVar1 = false;
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,line_number,"",sFormat);
LAB_0039802d:
  if (bVar1 != false) {
    *sizeof_string = (ulong)local_1c;
  }
  return bVar1;
}

Assistant:

bool
ON_BinaryArchive::ReadStringSize( // Read size of nullptr terminated string
    size_t* sizeof_string          // (returned size includes nullptr terminator)
    )
{
  ON__UINT32 ui32 = 0;
  bool rc = ReadInt32(1,(ON__INT32*)&ui32);
  // Note that ui32 = number of elements in the string array, including
  // the null terminator.  So ui32 should either be 0 or be >= 2.
  // The string array elements can be chars or unsigned shorts;
  // therefore the number of bytes in the string cannot be determined
  // at this point because we don't know what type of string is
  // being read.
  if (rc)
  {
    // 8 October 2004 Dale Lear
    //    Added the sanity checks on string size to avoid attempts
    //    to allocate huge amounts of memory when the value
    //    comes from a damaged file.
    if ( 0 != (0xF000000 & ui32) )
    {
      // 268 million chars oughta be plenty
      ON_ERROR("string element count is impossibly large");
      rc = false;
    }
    else if ( ui32 > 0 )
    {
      // make sure this is possible
      const ON_3DM_BIG_CHUNK* curchunk = m_chunk.Last();
      if ( 0 != curchunk && 0 == (TCODE_SHORT & curchunk->m_typecode) )
      {
        if (    curchunk->m_big_value < 0 
             || ((ON__INT64)ui32) > curchunk->m_big_value 
           )
        {
          ON_ERROR("string element count exceeds current chunk size");
          rc = false;
        }
      }
    }

    if (rc)
    {
      *sizeof_string = (size_t)ui32;
    }
  }
  return rc;
}